

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

PHYSFS_Io * ZIP_openRead(void *opaque,char *filename)

{
  code *pcVar1;
  _func_PHYSFS_sint64_PHYSFS_Io_ptr_void_ptr_PHYSFS_uint64 *p_Var2;
  undefined1 *ptr_00;
  undefined8 uVar3;
  int iVar4;
  char *pcVar5;
  size_t __n;
  void *pvVar6;
  PHYSFS_Io *pPVar7;
  PHYSFS_Io *pPVar8;
  PHYSFS_uint8 *pPVar9;
  PHYSFS_sint64 PVar10;
  ZIPfileinfo **ppZVar11;
  ZIPfileinfo **ppZVar12;
  ZIPfileinfo *local_88;
  undefined1 *local_80;
  PHYSFS_uint8 local_74 [8];
  PHYSFS_uint8 crypto_header [12];
  char *str;
  size_t len;
  char *ptr;
  PHYSFS_uint8 *password;
  PHYSFS_Io *io;
  ZIPfileinfo *finfo;
  ZIPentry *entry;
  ZIPinfo *info;
  PHYSFS_Io *retval;
  char *filename_local;
  void *opaque_local;
  
  ppZVar11 = &local_88;
  finfo = (ZIPfileinfo *)zip_find_entry((ZIPinfo *)opaque,filename);
  io = (PHYSFS_Io *)0x0;
  ptr = (char *)0x0;
  ppZVar12 = &local_88;
  if (((finfo == (ZIPfileinfo *)0x0) && (ppZVar12 = &local_88, *(int *)((long)opaque + 0x2c) != 0))
     && (pcVar5 = strrchr(filename,0x24), ppZVar12 = &local_88, pcVar5 != (char *)0x0)) {
    __n = (long)pcVar5 - (long)filename;
    if (__n + 1 < 0x100) {
      ppZVar11 = (ZIPfileinfo **)((long)&local_88 - (__n + 0x18 & 0xfffffffffffffff0));
      local_80 = (undefined1 *)ppZVar11;
    }
    else {
      local_80 = (undefined1 *)0x0;
    }
    ptr_00 = local_80;
    *(undefined8 *)((long)ppZVar11 + -8) = 0x120ed5;
    pvVar6 = __PHYSFS_initSmallAlloc(ptr_00,__n + 1);
    crypto_header._4_8_ = pvVar6;
    if (pvVar6 == (void *)0x0) {
      *(undefined8 *)((long)ppZVar11 + -8) = 0x120eea;
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      return (PHYSFS_Io *)0x0;
    }
    *(undefined8 *)((long)ppZVar11 + -8) = 0x120f0a;
    memcpy(pvVar6,filename,__n);
    uVar3 = crypto_header._4_8_;
    *(undefined1 *)(crypto_header._4_8_ + __n) = 0;
    *(undefined8 *)((long)ppZVar11 + -8) = 0x120f23;
    finfo = (ZIPfileinfo *)zip_find_entry((ZIPinfo *)opaque,(char *)uVar3);
    uVar3 = crypto_header._4_8_;
    *(undefined8 *)((long)ppZVar11 + -8) = 0x120f30;
    __PHYSFS_smallFree((void *)uVar3);
    ptr = pcVar5 + 1;
    ppZVar12 = ppZVar11;
  }
  if (finfo == (ZIPfileinfo *)0x0) {
    return (PHYSFS_Io *)0x0;
  }
  pPVar7 = *(PHYSFS_Io **)((long)opaque + 0x20);
  *(undefined8 *)((long)ppZVar12 + -8) = 0x120f6d;
  iVar4 = zip_resolve(pPVar7,(ZIPinfo *)opaque,(ZIPentry *)finfo);
  if (iVar4 == 0) {
    return (PHYSFS_Io *)0x0;
  }
  if (finfo->crypto_keys[0] != 0) {
    *(undefined8 *)((long)ppZVar12 + -8) = 0x120f97;
    PHYSFS_setErrorCode(PHYSFS_ERR_NOT_A_FILE);
    return (PHYSFS_Io *)0x0;
  }
  *(undefined8 *)((long)ppZVar12 + -8) = 0x120fb1;
  pPVar7 = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(0x50);
  if (pPVar7 == (PHYSFS_Io *)0x0) {
    *(undefined8 *)((long)ppZVar12 + -8) = 0x120fc6;
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
  }
  else {
    *(undefined8 *)((long)ppZVar12 + -8) = 0x120fd8;
    io = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(0xa8);
    if ((ZIPfileinfo *)io == (ZIPfileinfo *)0x0) {
      *(undefined8 *)((long)ppZVar12 + -8) = 0x120fed;
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
    }
    else {
      *(undefined8 *)((long)ppZVar12 + -8) = 0x121004;
      memset(io,0,0xa8);
      pPVar8 = *(PHYSFS_Io **)((long)opaque + 0x20);
      *(undefined8 *)((long)ppZVar12 + -8) = 0x121019;
      pPVar8 = zip_get_io(pPVar8,(ZIPinfo *)opaque,(ZIPentry *)finfo);
      if (pPVar8 != (PHYSFS_Io *)0x0) {
        ((ZIPfileinfo *)io)->io = pPVar8;
        if (*(long *)(finfo->crypto_keys + 2) == 0) {
          local_88 = finfo;
        }
        else {
          local_88 = *(ZIPfileinfo **)(finfo->crypto_keys + 2);
        }
        ((ZIPfileinfo *)io)->entry = (ZIPentry *)local_88;
        *(undefined8 *)((long)ppZVar12 + -8) = 0x121070;
        initializeZStream(&((ZIPfileinfo *)io)->stream);
        if (((ZIPfileinfo *)io)->entry->compression_method != 0) {
          *(undefined8 *)((long)ppZVar12 + -8) = 0x12108b;
          pPVar9 = (PHYSFS_uint8 *)(*__PHYSFS_AllocatorHooks.Malloc)(0x4000);
          ((ZIPfileinfo *)io)->buffer = pPVar9;
          if (((ZIPfileinfo *)io)->buffer == (PHYSFS_uint8 *)0x0) {
            *(undefined8 *)((long)ppZVar12 + -8) = 0x1210ad;
            PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
            goto LAB_00121180;
          }
          *(undefined8 *)((long)ppZVar12 + -8) = 0x1210c4;
          iVar4 = mz_inflateInit2(&((ZIPfileinfo *)io)->stream,-0xf);
          *(undefined8 *)((long)ppZVar12 + -8) = 0x1210cb;
          iVar4 = zlib_err(iVar4);
          if (iVar4 != 0) goto LAB_00121180;
        }
        *(undefined8 *)((long)ppZVar12 + -8) = 0x1210e2;
        iVar4 = zip_entry_is_tradional_crypto((ZIPentry *)finfo);
        if (iVar4 == 0) {
          if (ptr == (char *)0x0) {
LAB_00121155:
            *(undefined8 *)((long)ppZVar12 + -8) = 0x12116a;
            memcpy(pPVar7,&ZIP_Io,0x50);
            pPVar7->opaque = io;
            return pPVar7;
          }
          *(undefined8 *)((long)ppZVar12 + -8) = 0x1210fa;
          PHYSFS_setErrorCode(PHYSFS_ERR_BAD_PASSWORD);
        }
        else if (ptr == (char *)0x0) {
          *(undefined8 *)((long)ppZVar12 + -8) = 0x121116;
          PHYSFS_setErrorCode(PHYSFS_ERR_BAD_PASSWORD);
        }
        else {
          p_Var2 = pPVar8->read;
          *(undefined8 *)((long)ppZVar12 + -8) = 0x121131;
          PVar10 = (*p_Var2)(pPVar8,local_74,0xc);
          if (PVar10 == 0xc) {
            *(undefined8 *)((long)ppZVar12 + -8) = 0x12114a;
            iVar4 = zip_prep_crypto_keys((ZIPfileinfo *)io,local_74,(PHYSFS_uint8 *)ptr);
            if (iVar4 != 0) goto LAB_00121155;
          }
        }
      }
    }
  }
LAB_00121180:
  if (io != (PHYSFS_Io *)0x0) {
    if (io->opaque != (void *)0x0) {
      pcVar1 = *(code **)((long)io->opaque + 0x48);
      pvVar6 = io->opaque;
      *(undefined8 *)((long)ppZVar12 + -8) = 0x1211a8;
      (*pcVar1)(pvVar6);
    }
    if (io->write != (_func_PHYSFS_sint64_PHYSFS_Io_ptr_void_ptr_PHYSFS_uint64 *)0x0) {
      p_Var2 = io->write;
      *(undefined8 *)((long)ppZVar12 + -8) = 0x1211c4;
      (*__PHYSFS_AllocatorHooks.Free)(p_Var2);
      *(undefined8 *)((long)ppZVar12 + -8) = 0x1211d1;
      mz_inflateEnd((mz_streamp)&io->duplicate);
    }
    *(undefined8 *)((long)ppZVar12 + -8) = 0x1211de;
    (*__PHYSFS_AllocatorHooks.Free)(io);
  }
  if (pPVar7 != (PHYSFS_Io *)0x0) {
    *(undefined8 *)((long)ppZVar12 + -8) = 0x1211f2;
    (*__PHYSFS_AllocatorHooks.Free)(pPVar7);
  }
  return (PHYSFS_Io *)0x0;
}

Assistant:

static PHYSFS_Io *ZIP_openRead(void *opaque, const char *filename)
{
    PHYSFS_Io *retval = NULL;
    ZIPinfo *info = (ZIPinfo *) opaque;
    ZIPentry *entry = zip_find_entry(info, filename);
    ZIPfileinfo *finfo = NULL;
    PHYSFS_Io *io = NULL;
    PHYSFS_uint8 *password = NULL;

    /* if not found, see if maybe "$PASSWORD" is appended. */
    if ((!entry) && (info->has_crypto))
    {
        const char *ptr = strrchr(filename, '$');
        if (ptr != NULL)
        {
            const size_t len = (size_t) (ptr - filename);
            char *str = (char *) __PHYSFS_smallAlloc(len + 1);
            BAIL_IF(!str, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
            memcpy(str, filename, len);
            str[len] = '\0';
            entry = zip_find_entry(info, str);
            __PHYSFS_smallFree(str);
            password = (PHYSFS_uint8 *) (ptr + 1);
        } /* if */
    } /* if */

    BAIL_IF_ERRPASS(!entry, NULL);

    BAIL_IF_ERRPASS(!zip_resolve(info->io, info, entry), NULL);

    BAIL_IF(entry->tree.isdir, PHYSFS_ERR_NOT_A_FILE, NULL);

    retval = (PHYSFS_Io *) allocator.Malloc(sizeof (PHYSFS_Io));
    GOTO_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, ZIP_openRead_failed);

    finfo = (ZIPfileinfo *) allocator.Malloc(sizeof (ZIPfileinfo));
    GOTO_IF(!finfo, PHYSFS_ERR_OUT_OF_MEMORY, ZIP_openRead_failed);
    memset(finfo, '\0', sizeof (ZIPfileinfo));

    io = zip_get_io(info->io, info, entry);
    GOTO_IF_ERRPASS(!io, ZIP_openRead_failed);
    finfo->io = io;
    finfo->entry = ((entry->symlink != NULL) ? entry->symlink : entry);
    initializeZStream(&finfo->stream);

    if (finfo->entry->compression_method != COMPMETH_NONE)
    {
        finfo->buffer = (PHYSFS_uint8 *) allocator.Malloc(ZIP_READBUFSIZE);
        if (!finfo->buffer)
            GOTO(PHYSFS_ERR_OUT_OF_MEMORY, ZIP_openRead_failed);
        else if (zlib_err(inflateInit2(&finfo->stream, -MAX_WBITS)) != Z_OK)
            goto ZIP_openRead_failed;
    } /* if */

    if (!zip_entry_is_tradional_crypto(entry))
        GOTO_IF(password != NULL, PHYSFS_ERR_BAD_PASSWORD, ZIP_openRead_failed);
    else
    {
        PHYSFS_uint8 crypto_header[12];
        GOTO_IF(password == NULL, PHYSFS_ERR_BAD_PASSWORD, ZIP_openRead_failed);
        if (io->read(io, crypto_header, 12) != 12)
            goto ZIP_openRead_failed;
        else if (!zip_prep_crypto_keys(finfo, crypto_header, password))
            goto ZIP_openRead_failed;
    } /* if */

    memcpy(retval, &ZIP_Io, sizeof (PHYSFS_Io));
    retval->opaque = finfo;

    return retval;

ZIP_openRead_failed:
    if (finfo != NULL)
    {
        if (finfo->io != NULL)
            finfo->io->destroy(finfo->io);

        if (finfo->buffer != NULL)
        {
            allocator.Free(finfo->buffer);
            inflateEnd(&finfo->stream);
        } /* if */

        allocator.Free(finfo);
    } /* if */

    if (retval != NULL)
        allocator.Free(retval);

    return NULL;
}